

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SliceStaticLayerParams::SliceStaticLayerParams(SliceStaticLayerParams *this)

{
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SliceStaticLayerParams_00347af0;
  (this->beginmasks_).current_size_ = 0;
  (this->beginmasks_).total_size_ = 0;
  (this->beginmasks_).rep_ = (Rep *)0x0;
  (this->endids_).current_size_ = 0;
  (this->endids_).total_size_ = 0;
  (this->endids_).rep_ = (Rep *)0x0;
  (this->endmasks_).current_size_ = 0;
  (this->endmasks_).total_size_ = 0;
  (this->endmasks_).rep_ = (Rep *)0x0;
  (this->strides_).current_size_ = 0;
  (this->strides_).total_size_ = 0;
  (this->strides_).rep_ = (Rep *)0x0;
  (this->squeezemasks_).current_size_ = 0;
  (this->squeezemasks_).total_size_ = 0;
  (this->squeezemasks_).rep_ = (Rep *)0x0;
  (this->beginids_).rep_ = (Rep *)0x0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->beginids_).current_size_ = 0;
  (this->beginids_).total_size_ = 0;
  if (this != (SliceStaticLayerParams *)&_SliceStaticLayerParams_default_instance_) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  return;
}

Assistant:

SliceStaticLayerParams::SliceStaticLayerParams()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_NeuralNetwork_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.SliceStaticLayerParams)
}